

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::OnItem(cmGraphVizWriter *this,cmLinkItem *item)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  string *__k;
  mapped_type *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_98;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *pcStack_60;
  cmAlphaNum local_58;
  
  bVar3 = ItemExcluded(this,item);
  if (!bVar3) {
    pcVar1 = (this->GraphNodePrefix)._M_dataplus._M_p;
    sVar2 = (this->GraphNodePrefix)._M_string_length;
    cmAlphaNum::cmAlphaNum(&local_58,this->NextNodeId);
    local_68 = local_58.View_._M_len;
    pcStack_60 = local_58.View_._M_str;
    views._M_len = 2;
    views._M_array = &local_78;
    local_78._M_len = sVar2;
    local_78._M_str = pcVar1;
    cmCatViews_abi_cxx11_(&local_98,views);
    __k = cmLinkItem::AsStr_abi_cxx11_(item);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->NodeNames,__k);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    this->NextNodeId = this->NextNodeId + 1;
    WriteNode(this,&this->GlobalFileStream,item);
  }
  return;
}

Assistant:

void cmGraphVizWriter::OnItem(cmLinkItem const& item)
{
  if (this->ItemExcluded(item)) {
    return;
  }

  this->NodeNames[item.AsStr()] =
    cmStrCat(this->GraphNodePrefix, this->NextNodeId);
  ++this->NextNodeId;

  this->WriteNode(this->GlobalFileStream, item);
}